

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fragment_uri.h
# Opt level: O0

void __thiscall
ktx::SelectorRange::SelectorRange(SelectorRange *this,RangeIndex begin,RangeIndex end)

{
  HalfRange *in_stack_ffffffffffffffd8;
  vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
  *in_stack_ffffffffffffffe0;
  
  std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::vector
            ((vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>
              *)0x27b630);
  std::vector<ktx::SelectorRange::HalfRange,_std::allocator<ktx::SelectorRange::HalfRange>_>::
  emplace_back<ktx::SelectorRange::HalfRange>(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

SelectorRange(RangeIndex begin, RangeIndex end) {
        ranges.emplace_back(HalfRange{begin, end});
    }